

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

int main(void)

{
  unique_ptr<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_> uVar1;
  uchar *puVar2;
  uchar *puVar3;
  unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_> uVar4;
  ostream *poVar5;
  qpdf_offset_t qVar6;
  void *pvVar7;
  size_t sVar8;
  Buffer *this;
  logic_error *this_00;
  size_t in_RCX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  exception *e;
  logic_error *e_2;
  size_t len;
  uchar *mbuf;
  Pl_Buffer bp4;
  Pl_Buffer bp3;
  Buffer b1;
  uchar lbuf [10];
  exception *e_1;
  Pl_Buffer bp2;
  Buffer *b;
  Pl_Buffer bp1;
  Pl_Count count;
  Pl_Discard discard;
  uchar *bm6p;
  Buffer bm6;
  uchar *bm5p;
  Buffer bm5;
  uchar *bm4p;
  string local_f0;
  Buffer local_d0;
  Buffer bm4;
  uchar *bm3p;
  Buffer bm3;
  uchar *bm2p;
  Buffer bm2;
  uchar *bm1p;
  Buffer bm1;
  uchar *bc4p;
  Buffer bc4;
  uchar *bc3p;
  string local_70;
  Buffer local_50;
  Buffer bc3;
  uchar *bc2p;
  Buffer bc2;
  uchar *bc1p;
  Buffer bc1;
  
  bc1.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl._4_4_ = 0;
  Buffer::Buffer((Buffer *)&bc1p,2);
  puVar2 = Buffer::getBuffer((Buffer *)&bc1p);
  *puVar2 = 'Q';
  puVar2[1] = 'W';
  Buffer::copy((Buffer *)&bc2p,(EVP_PKEY_CTX *)&bc1p,src);
  *puVar2 = 'R';
  puVar3 = Buffer::getBuffer((Buffer *)&bc2p);
  if (puVar3 == puVar2) {
    __assert_fail("bc2p != bc1p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x1d,"int main()");
  }
  if (*puVar3 != 'Q') {
    __assert_fail("bc2p[0] == \'Q\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x1e,"int main()");
  }
  if (puVar3[1] != 'W') {
    __assert_fail("bc2p[1] == \'W\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x1f,"int main()");
  }
  Buffer::copy(&bc3,(EVP_PKEY_CTX *)&bc1p,src_00);
  Buffer::operator=((Buffer *)&bc2p,&bc3);
  Buffer::~Buffer(&bc3);
  puVar3 = Buffer::getBuffer((Buffer *)&bc2p);
  if (puVar3 == puVar2) {
    __assert_fail("bc2p != bc1p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x22,"int main()");
  }
  if (*puVar3 != 'R') {
    __assert_fail("bc2p[0] == \'R\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x23,"int main()");
  }
  if (puVar3[1] != 'W') {
    __assert_fail("bc2p[1] == \'W\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x24,"int main()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"QW",(allocator<char> *)((long)&bc3p + 7));
  Buffer::Buffer(&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bc3p + 7));
  bc4.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
       Buffer::getBuffer(&local_50);
  Buffer::copy((Buffer *)&bc4p,(EVP_PKEY_CTX *)&local_50,src_01);
  *(undefined1 *)
   bc4.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
   super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
   super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl = 0x52;
  uVar4._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (__uniq_ptr_data<Buffer::Members,_std::default_delete<Buffer::Members>,_true,_true>)
       Buffer::getBuffer((Buffer *)&bc4p);
  if ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
      uVar4._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl ==
      bc4.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl) {
    __assert_fail("bc4p != bc3p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x2c,"int main()");
  }
  if (*(uchar *)uVar4._M_t.
                super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
                super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
                super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl != 'Q') {
    __assert_fail("bc4p[0] == \'Q\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x2d,"int main()");
  }
  if (*(uchar *)((long)uVar4._M_t.
                       super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                       .super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl + 1) != 'W') {
    __assert_fail("bc4p[1] == \'W\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x2e,"int main()");
  }
  Buffer::copy(&bm1,(EVP_PKEY_CTX *)&local_50,src_02);
  Buffer::operator=((Buffer *)&bc4p,&bm1);
  Buffer::~Buffer(&bm1);
  uVar4._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (__uniq_ptr_data<Buffer::Members,_std::default_delete<Buffer::Members>,_true,_true>)
       Buffer::getBuffer((Buffer *)&bc4p);
  if ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
      uVar4._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl ==
      bc4.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl) {
    __assert_fail("bc4p != bc3p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x31,"int main()");
  }
  if (*(uchar *)uVar4._M_t.
                super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
                super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
                super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl != 'R') {
    __assert_fail("bc4p[0] == \'R\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x32,"int main()");
  }
  if (*(uchar *)((long)uVar4._M_t.
                       super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                       .super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl + 1) != 'W') {
    __assert_fail("bc4p[1] == \'W\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x33,"int main()");
  }
  Buffer::Buffer((Buffer *)&bm1p,2);
  bm2.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
       Buffer::getBuffer((Buffer *)&bm1p);
  *(uchar *)bm2.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>
            ._M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
            super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl = 'Q';
  *(uchar *)((long)bm2.m._M_t.
                   super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
                   super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl + 1) = 'W';
  Buffer::Buffer((Buffer *)&bm2p,(Buffer *)&bm1p);
  *(undefined1 *)
   bm2.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
   super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
   super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl = 0x52;
  bm3.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
       Buffer::getBuffer((Buffer *)&bm2p);
  if (bm3.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl !=
      bm2.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl) {
    __assert_fail("bm2p == bm1p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x3d,"int main()");
  }
  if (*(uchar *)bm3.m._M_t.
                super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
                super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
                super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl != 'R') {
    __assert_fail("bm2p[0] == \'R\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x3e,"int main()");
  }
  Buffer::Buffer((Buffer *)&bm3p,(Buffer *)&bm2p);
  bm4.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
       Buffer::getBuffer((Buffer *)&bm3p);
  if (bm4.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl !=
      bm3.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl) {
    __assert_fail("bm3p == bm2p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x42,"int main()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"QW",(allocator<char> *)((long)&bm4p + 7));
  Buffer::Buffer(&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bm4p + 7));
  bm5.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
       Buffer::getBuffer(&local_d0);
  Buffer::Buffer((Buffer *)&bm5p,&local_d0);
  *(undefined1 *)
   bm5.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
   super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
   super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl = 0x52;
  bm6.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
  super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
       (unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
       Buffer::getBuffer((Buffer *)&bm5p);
  if (bm6.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl ==
      bm5.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
      super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl) {
    if (*(uchar *)bm6.m._M_t.
                  super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t
                  .super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
                  super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl != 'R') {
      __assert_fail("bm5p[0] == \'R\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                    ,0x4b,"int main()");
    }
    Buffer::Buffer((Buffer *)&bm6p,(Buffer *)&bm5p);
    uVar4._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>._M_t.
    super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
    super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl =
         (__uniq_ptr_data<Buffer::Members,_std::default_delete<Buffer::Members>,_true,_true>)
         Buffer::getBuffer((Buffer *)&bm6p);
    if ((unique_ptr<Buffer::Members,_std::default_delete<Buffer::Members>_>)
        uVar4._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>.
        _M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
        super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl ==
        bm6.m._M_t.super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>.
        _M_t.super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>.
        super__Head_base<0UL,_Buffer::Members_*,_false>._M_head_impl) {
      Pl_Discard::Pl_Discard((Pl_Discard *)&count.m);
      Pl_Count::Pl_Count((Pl_Count *)&bp1.m,"count",(Pipeline *)&count.m);
      Pl_Buffer::Pl_Buffer((Pl_Buffer *)&b,"bp1",(Pipeline *)&bp1.m);
      puVar2 = uc("12345");
      Pl_Buffer::write((Pl_Buffer *)&b,(int)puVar2,(void *)0x5,in_RCX);
      puVar2 = uc("67890");
      Pl_Buffer::write((Pl_Buffer *)&b,(int)puVar2,(void *)0x5,in_RCX);
      Pl_Buffer::finish((Pl_Buffer *)&b);
      poVar5 = std::operator<<((ostream *)&std::cout,"count: ");
      qVar6 = Pl_Count::getCount((Pl_Count *)&bp1.m);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,qVar6);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      puVar2 = uc("abcde");
      Pl_Buffer::write((Pl_Buffer *)&b,(int)puVar2,(void *)0x5,in_RCX);
      puVar2 = uc("fghij");
      Pl_Buffer::write((Pl_Buffer *)&b,(int)puVar2,(void *)0x6,in_RCX);
      Pl_Buffer::finish((Pl_Buffer *)&b);
      poVar5 = std::operator<<((ostream *)&std::cout,"count: ");
      qVar6 = Pl_Count::getCount((Pl_Count *)&bp1.m);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,qVar6);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      bp2.m._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
      ._M_t.super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
      super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl =
           (__uniq_ptr_data<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>,_true,_true>
           )Pl_Buffer::getBuffer((Pl_Buffer *)&b);
      poVar5 = std::operator<<((ostream *)&std::cout,"size: ");
      sVar8 = Buffer::getSize((Buffer *)
                              bp2.m._M_t.
                              super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                              .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar8);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"data: ");
      puVar2 = Buffer::getBuffer((Buffer *)
                                 bp2.m._M_t.
                                 super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                 .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
      poVar5 = std::operator<<(poVar5,puVar2);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      uVar1 = bp2.m;
      if ((__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)
          bp2.m._M_t.
          super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
          super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)0x0) {
        Buffer::~Buffer((Buffer *)
                        bp2.m._M_t.
                        super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                        .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
        operator_delete((void *)uVar1._M_t.
                                super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl,8);
      }
      puVar2 = uc("qwert");
      Pl_Buffer::write((Pl_Buffer *)&b,(int)puVar2,(void *)0x5,in_RCX);
      puVar2 = uc("yuiop");
      Pl_Buffer::write((Pl_Buffer *)&b,(int)puVar2,(void *)0x6,in_RCX);
      Pl_Buffer::finish((Pl_Buffer *)&b);
      poVar5 = std::operator<<((ostream *)&std::cout,"count: ");
      qVar6 = Pl_Count::getCount((Pl_Count *)&bp1.m);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,qVar6);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      bp2.m._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
      ._M_t.super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
      super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl =
           (__uniq_ptr_data<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>,_true,_true>
           )Pl_Buffer::getBuffer((Pl_Buffer *)&b);
      poVar5 = std::operator<<((ostream *)&std::cout,"size: ");
      sVar8 = Buffer::getSize((Buffer *)
                              bp2.m._M_t.
                              super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                              .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar8);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"data: ");
      puVar2 = Buffer::getBuffer((Buffer *)
                                 bp2.m._M_t.
                                 super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                 .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
      poVar5 = std::operator<<(poVar5,puVar2);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      uVar1 = bp2.m;
      if ((__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)
          bp2.m._M_t.
          super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
          super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)0x0) {
        Buffer::~Buffer((Buffer *)
                        bp2.m._M_t.
                        super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                        .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
        operator_delete((void *)uVar1._M_t.
                                super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl,8);
      }
      Pl_Buffer::Pl_Buffer((Pl_Buffer *)&e_1,"bp2",(Pipeline *)0x0);
      puVar2 = uc("moo");
      Pl_Buffer::write((Pl_Buffer *)&e_1,(int)puVar2,(void *)0x3,in_RCX);
      puVar2 = uc("quack");
      Pl_Buffer::write((Pl_Buffer *)&e_1,(int)puVar2,(void *)0x6,in_RCX);
      this = Pl_Buffer::getBuffer((Pl_Buffer *)&e_1);
      if (this != (Buffer *)0x0) {
        Buffer::~Buffer(this);
        operator_delete(this,8);
      }
      Pl_Buffer::finish((Pl_Buffer *)&e_1);
      bp2.m._M_t.super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
      ._M_t.super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
      super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl =
           (__uniq_ptr_data<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>,_true,_true>
           )Pl_Buffer::getBuffer((Pl_Buffer *)&e_1);
      poVar5 = std::operator<<((ostream *)&std::cout,"size: ");
      sVar8 = Buffer::getSize((Buffer *)
                              bp2.m._M_t.
                              super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                              .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
      pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar8);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"data: ");
      puVar2 = Buffer::getBuffer((Buffer *)
                                 bp2.m._M_t.
                                 super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                 .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
      poVar5 = std::operator<<(poVar5,puVar2);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      uVar1 = bp2.m;
      if ((__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)
          bp2.m._M_t.
          super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
          super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)0x0) {
        Buffer::~Buffer((Buffer *)
                        bp2.m._M_t.
                        super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                        .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
        operator_delete((void *)uVar1._M_t.
                                super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl,8);
      }
      Buffer::Buffer((Buffer *)&bp3.m,
                     (uchar *)((long)&b1.m._M_t.
                                      super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                                      .super__Head_base<0UL,_Buffer::Members_*,_false> + 6),10);
      puVar3 = Buffer::getBuffer((Buffer *)&bp3.m);
      puVar2 = (uchar *)((long)&b1.m._M_t.
                                super___uniq_ptr_impl<Buffer::Members,_std::default_delete<Buffer::Members>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Buffer::Members_*,_std::default_delete<Buffer::Members>_>
                                .super__Head_base<0UL,_Buffer::Members_*,_false> + 6);
      if (puVar3 == puVar2) {
        sVar8 = Buffer::getSize((Buffer *)&bp3.m);
        if (sVar8 == 10) {
          Pl_Buffer::Pl_Buffer((Pl_Buffer *)&bp4.m,"bp3",(Pipeline *)0x0);
          bp2.m._M_t.
          super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
          super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl =
               (__uniq_ptr_data<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>,_true,_true>
                )Pl_Buffer::getBuffer((Pl_Buffer *)&bp4.m);
          poVar5 = std::operator<<((ostream *)&std::cout,"size: ");
          sVar8 = Buffer::getSize((Buffer *)
                                  bp2.m._M_t.
                                  super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                  .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
          pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar8);
          std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
          uVar1 = bp2.m;
          if ((__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)
              bp2.m._M_t.
              super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>.
              _M_t.
              super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
              .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)0x0) {
            Buffer::~Buffer((Buffer *)
                            bp2.m._M_t.
                            super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                            .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
            operator_delete((void *)uVar1._M_t.
                                    super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                    .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl
                            ,8);
          }
          bp2.m._M_t.
          super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
          super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl =
               (__uniq_ptr_data<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>,_true,_true>
                )Pl_Buffer::getBuffer((Pl_Buffer *)&bp4.m);
          poVar5 = std::operator<<((ostream *)&std::cout,"size: ");
          sVar8 = Buffer::getSize((Buffer *)
                                  bp2.m._M_t.
                                  super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                  .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
          pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar8);
          std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
          uVar1 = bp2.m;
          if ((__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)
              bp2.m._M_t.
              super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>.
              _M_t.
              super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
              .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)0x0) {
            Buffer::~Buffer((Buffer *)
                            bp2.m._M_t.
                            super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                            .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
            operator_delete((void *)uVar1._M_t.
                                    super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                    .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl
                            ,8);
          }
          puVar3 = uc("");
          Pl_Buffer::write((Pl_Buffer *)&bp4.m,(int)puVar3,(void *)0x0,(size_t)puVar2);
          Pl_Buffer::finish((Pl_Buffer *)&bp4.m);
          bp2.m._M_t.
          super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
          super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
          super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl =
               (__uniq_ptr_data<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>,_true,_true>
                )Pl_Buffer::getBuffer((Pl_Buffer *)&bp4.m);
          poVar5 = std::operator<<((ostream *)&std::cout,"size: ");
          sVar8 = Buffer::getSize((Buffer *)
                                  bp2.m._M_t.
                                  super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                  .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
          pvVar7 = (void *)std::ostream::operator<<(poVar5,sVar8);
          std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
          uVar1 = bp2.m;
          if ((__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)
              bp2.m._M_t.
              super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>.
              _M_t.
              super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
              .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>)0x0) {
            Buffer::~Buffer((Buffer *)
                            bp2.m._M_t.
                            super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                            .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl);
            operator_delete((void *)uVar1._M_t.
                                    super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>
                                    .super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl
                            ,8);
          }
          Pl_Buffer::Pl_Buffer((Pl_Buffer *)&mbuf,"bp4",(Pipeline *)0x0);
          puVar3 = uc("asdf");
          Pl_Buffer::write((Pl_Buffer *)&mbuf,(int)puVar3,(void *)0x4,(size_t)puVar2);
          Pl_Buffer::getMallocBuffer((Pl_Buffer *)&mbuf,(uchar **)&len,(size_t *)&e_2);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                        ,0x94,"int main()");
        }
      }
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"hand-created buffer is not as expected");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    __assert_fail("bm6p == bm5p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                  ,0x4f,"int main()");
  }
  __assert_fail("bm5p == bm4p",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/buffer.cc"
                ,0x4a,"int main()");
}

Assistant:

int
main()
{
    // Test that buffers can be copied by value using Buffer::copy.
    Buffer bc1(2);
    unsigned char* bc1p = bc1.getBuffer();
    bc1p[0] = 'Q';
    bc1p[1] = 'W';
    Buffer bc2(bc1.copy());
    bc1p[0] = 'R';
    unsigned char* bc2p = bc2.getBuffer();
    assert(bc2p != bc1p);
    assert(bc2p[0] == 'Q');
    assert(bc2p[1] == 'W');
    bc2 = bc1.copy();
    bc2p = bc2.getBuffer();
    assert(bc2p != bc1p);
    assert(bc2p[0] == 'R');
    assert(bc2p[1] == 'W');

    // Test Buffer(std:string&&)
    Buffer bc3("QW");
    unsigned char* bc3p = bc3.getBuffer();
    Buffer bc4(bc3.copy());
    bc3p[0] = 'R';
    unsigned char* bc4p = bc4.getBuffer();
    assert(bc4p != bc3p);
    assert(bc4p[0] == 'Q');
    assert(bc4p[1] == 'W');
    bc4 = bc3.copy();
    bc4p = bc4.getBuffer();
    assert(bc4p != bc3p);
    assert(bc4p[0] == 'R');
    assert(bc4p[1] == 'W');

    // Test that buffers can be moved.
    Buffer bm1(2);
    unsigned char* bm1p = bm1.getBuffer();
    bm1p[0] = 'Q';
    bm1p[1] = 'W';
    Buffer bm2(std::move(bm1));
    bm1p[0] = 'R';
    unsigned char* bm2p = bm2.getBuffer();
    assert(bm2p == bm1p);
    assert(bm2p[0] == 'R');

    Buffer bm3 = std::move(bm2);
    unsigned char* bm3p = bm3.getBuffer();
    assert(bm3p == bm2p);

    // Test Buffer(dtd::string&&)
    Buffer bm4("QW");
    unsigned char* bm4p = bm4.getBuffer();
    Buffer bm5(std::move(bm4));
    bm4p[0] = 'R';
    unsigned char* bm5p = bm5.getBuffer();
    assert(bm5p == bm4p);
    assert(bm5p[0] == 'R');

    Buffer bm6 = std::move(bm5);
    unsigned char* bm6p = bm6.getBuffer();
    assert(bm6p == bm5p);

    try {
        Pl_Discard discard;
        Pl_Count count("count", &discard);
        Pl_Buffer bp1("bp1", &count);
        bp1.write(uc("12345"), 5);
        bp1.write(uc("67890"), 5);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        bp1.write(uc("abcde"), 5);
        bp1.write(uc("fghij"), 6);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        Buffer* b = bp1.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;
        bp1.write(uc("qwert"), 5);
        bp1.write(uc("yuiop"), 6);
        bp1.finish();
        std::cout << "count: " << count.getCount() << std::endl;
        b = bp1.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;

        Pl_Buffer bp2("bp2");
        bp2.write(uc("moo"), 3);
        bp2.write(uc("quack"), 6);
        try {
            delete bp2.getBuffer();
        } catch (std::exception& e) {
            std::cout << e.what() << std::endl;
        }
        bp2.finish();
        b = bp2.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        std::cout << "data: " << b->getBuffer() << std::endl;
        delete b;

        unsigned char lbuf[10];
        Buffer b1(lbuf, 10);
        if (!((b1.getBuffer() == lbuf) && (b1.getSize() == 10))) {
            throw std::logic_error("hand-created buffer is not as expected");
        }

        Pl_Buffer bp3("bp3");
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;
        // Should be able to call getBuffer again and get an empty buffer
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;
        // Also can write 0 and do it.
        bp3.write(uc(""), 0);
        bp3.finish();
        b = bp3.getBuffer();
        std::cout << "size: " << b->getSize() << std::endl;
        delete b;

        // Malloc buffer should behave similarly.
        Pl_Buffer bp4("bp4");
        bp4.write(uc("asdf"), 4);
        unsigned char* mbuf;
        size_t len;
        try {
            bp4.getMallocBuffer(&mbuf, &len);
            assert(false);
        } catch (std::logic_error& e) {
            std::cout << "malloc buffer logic error: " << e.what() << std::endl;
        }
        bp4.finish();
        bp4.getMallocBuffer(&mbuf, &len);
        assert(len == 4);
        assert(memcmp(mbuf, uc("asdf"), 4) == 0);
        free(mbuf);
        bp4.write(uc(""), 0);
        bp4.finish();
        bp4.getMallocBuffer(&mbuf, &len);
        assert(mbuf == nullptr);
        assert(len == 0);
    } catch (std::exception& e) {
        std::cout << "unexpected exception: " << e.what() << std::endl;
        exit(2);
    }

    std::cout << "done" << std::endl;
    return 0;
}